

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O2

bool duckdb::ValueOperations::DistinctGreaterThanEquals(Value *left,Value *right)

{
  bool bVar1;
  
  bVar1 = DistinctGreaterThan(right,left);
  return !bVar1;
}

Assistant:

bool ValueOperations::DistinctGreaterThanEquals(const Value &left, const Value &right) {
	return !ValueOperations::DistinctGreaterThan(right, left);
}